

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.cc
# Opt level: O1

void __thiscall flow::Runner::consume(Runner *this,Opcode opcode)

{
  long lVar1;
  QuotaExceeded *this_00;
  long lVar2;
  
  lVar1 = this->quota_;
  if (lVar1 == -1) {
    return;
  }
  switch((uint)opcode) {
  case 6:
  case 0x10:
    lVar2 = 4;
    break;
  case 7:
    lVar2 = 0;
    break;
  case 9:
  case 10:
    lVar2 = 2;
    break;
  default:
    if (opcode - 0x49 < 2) {
      lVar2 = 8;
      break;
    }
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    lVar2 = 1;
  }
  if (lVar1 - lVar2 != 0 && lVar2 <= lVar1) {
    this->quota_ = lVar1 - lVar2;
    return;
  }
  this->quota_ = 0;
  this_00 = (QuotaExceeded *)__cxa_allocate_exception(0x10);
  QuotaExceeded::QuotaExceeded(this_00);
  __cxa_throw(this_00,&QuotaExceeded::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Runner::consume(Opcode opcode) {
  if (quota_ == NoQuota)
    return;

  unsigned price = getPrice(opcode);
  if (price >= quota_) {
    quota_ = 0;
    throw QuotaExceeded{};
  }

  quota_ -= price;
}